

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseBlock(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory data;
  bool bVar2;
  Bool BVar3;
  int iVar4;
  Node *pNVar5;
  tmbstr ptVar6;
  Dict *pDVar7;
  code *pcStack_a0;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  uint istackbase;
  Bool checkstack;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  bVar2 = true;
  memory.register_2 = 0;
  if (element == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    pNStack_20 = (Node *)memory.identity;
    lexer._4_4_ = (GetTokenMode)memory.reentry_node;
  }
  else {
    if ((element->tag->model & 1) != 0) {
      return (Node *)0x0;
    }
    if ((((((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
          (element->tag->id == TidyTag_DIV)) &&
         ((element->parent != (Node *)0x0 && (element->parent->tag != (Dict *)0x0)))) &&
        (element->parent->tag->id == TidyTag_DL)) && (BVar3 = prvTidyIsHTML5Mode(doc), BVar3 != no))
    {
      pNVar5 = prvTidyParseDefList(doc,element,mode);
      return pNVar5;
    }
    if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
       ((element->tag->id == TidyTag_FORM &&
        (BVar3 = DescendantOf(element,TidyTag_FORM), BVar3 != no)))) {
      prvTidyReport(doc,element,(Node *)0x0,0x243);
    }
    if ((element->tag->model & 0x800) != 0) {
      memory.register_2 = pLVar1->istackbase;
      pLVar1->istackbase = pLVar1->istacksize;
    }
    if ((element->tag->model & 0x20000) == 0) {
      prvTidyInlineDup(doc,(Node *)0x0);
    }
    pNStack_20 = element;
    if (((element->tag->model & 0x10) == 0) || ((element->tag->model & 0x400) != 0)) {
      lexer._4_4_ = IgnoreWhitespace;
    }
    else {
      lexer._4_4_ = mode;
      if (mode == IgnoreWhitespace) {
        lexer._4_4_ = MixedContent;
      }
    }
  }
LAB_0013e25b:
  _istackbase = prvTidyGetToken(doc,lexer._4_4_);
  if (_istackbase == (Node *)0x0) {
LAB_0013f15a:
    if ((pNStack_20->tag->model & 0x8000) == 0) {
      prvTidyReport(doc,pNStack_20,_istackbase,0x25a);
    }
    if ((pNStack_20->tag->model & 0x800) != 0) {
      while (pLVar1->istackbase < pLVar1->istacksize) {
        prvTidyPopInline(doc,(Node *)0x0);
      }
      pLVar1->istackbase = memory.register_2;
    }
    TrimSpaces(doc,pNStack_20);
    return (Node *)0x0;
  }
  if (((_istackbase->type == EndTag) && (_istackbase->tag != (Dict *)0x0)) &&
     ((_istackbase->tag == pNStack_20->tag || (pNStack_20->was == _istackbase->tag)))) {
    prvTidyFreeNode(doc,_istackbase);
    if ((pNStack_20->tag->model & 0x800) != 0) {
      while (pLVar1->istackbase < pLVar1->istacksize) {
        prvTidyPopInline(doc,(Node *)0x0);
      }
      pLVar1->istackbase = memory.register_2;
    }
    pNStack_20->closed = yes;
    TrimSpaces(doc,pNStack_20);
    return (Node *)0x0;
  }
  if (((((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
       (_istackbase->tag->id == TidyTag_HTML)) ||
      (((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
       (_istackbase->tag->id == TidyTag_HEAD)))) ||
     (((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
      (_istackbase->tag->id == TidyTag_BODY)))) {
    BVar3 = prvTidynodeIsElement(_istackbase);
    if (BVar3 != no) {
      prvTidyReport(doc,pNStack_20,_istackbase,0x235);
    }
    prvTidyFreeNode(doc,_istackbase);
    goto LAB_0013e25b;
  }
  if (_istackbase->type == EndTag) {
    if (_istackbase->tag == (Dict *)0x0) {
      prvTidyReport(doc,pNStack_20,_istackbase,0x235);
      prvTidyFreeNode(doc,_istackbase);
      goto LAB_0013e25b;
    }
    if (((_istackbase == (Node *)0x0) || (_istackbase->tag == (Dict *)0x0)) ||
       (_istackbase->tag->id != TidyTag_BR)) {
      if (((_istackbase == (Node *)0x0) || (_istackbase->tag == (Dict *)0x0)) ||
         (_istackbase->tag->id != TidyTag_P)) {
        BVar3 = DescendantOf(pNStack_20,_istackbase->tag->id);
        if (BVar3 != no) {
          prvTidyUngetToken(doc);
          goto LAB_0013f15a;
        }
        if ((pLVar1->exiled != no) &&
           ((BVar3 = prvTidynodeHasCM(_istackbase,0x80), BVar3 != no ||
            (((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
             (_istackbase->tag->id == TidyTag_TABLE)))))) {
          prvTidyUngetToken(doc);
          TrimSpaces(doc,pNStack_20);
          return (Node *)0x0;
        }
      }
      else {
        _istackbase->type = StartEndTag;
        _istackbase->implicit = yes;
      }
    }
    else {
      _istackbase->type = StartTag;
    }
  }
  BVar3 = prvTidynodeIsText(_istackbase);
  if (BVar3 == no) {
    BVar3 = InsertMisc(pNStack_20,_istackbase);
    if (BVar3 == no) {
      if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
         (_istackbase->tag->id == TidyTag_PARAM)) {
        BVar3 = prvTidynodeHasCM(pNStack_20,0x1000);
        if ((BVar3 == no) || (BVar3 = prvTidynodeIsElement(_istackbase), BVar3 == no)) {
          prvTidyReport(doc,pNStack_20,_istackbase,0x235);
          prvTidyFreeNode(doc,_istackbase);
        }
        else {
          prvTidyInsertNodeAtEnd(pNStack_20,_istackbase);
        }
        goto LAB_0013e25b;
      }
      if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
         (_istackbase->tag->id == TidyTag_AREA)) {
        if (((pNStack_20 == (Node *)0x0) || (pNStack_20->tag == (Dict *)0x0)) ||
           ((pNStack_20->tag->id != TidyTag_MAP ||
            (BVar3 = prvTidynodeIsElement(_istackbase), BVar3 == no)))) {
          prvTidyReport(doc,pNStack_20,_istackbase,0x235);
          prvTidyFreeNode(doc,_istackbase);
        }
        else {
          prvTidyInsertNodeAtEnd(pNStack_20,_istackbase);
        }
        goto LAB_0013e25b;
      }
      if (_istackbase->tag == (Dict *)0x0) {
        prvTidyReport(doc,pNStack_20,_istackbase,0x235);
        prvTidyFreeNode(doc,_istackbase);
        goto LAB_0013e25b;
      }
      BVar3 = prvTidynodeHasCM(_istackbase,0x10);
      if (BVar3 == no) {
        BVar3 = prvTidynodeIsElement(_istackbase);
        if (BVar3 == no) {
          if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
             (_istackbase->tag->id == TidyTag_FORM)) {
            BadForm(doc);
          }
          prvTidyReport(doc,pNStack_20,_istackbase,0x235);
          prvTidyFreeNode(doc,_istackbase);
          goto LAB_0013e25b;
        }
        if ((((pNStack_20 != (Node *)0x0) && (pNStack_20->tag != (Dict *)0x0)) &&
            (pNStack_20->tag->id == TidyTag_LI)) &&
           (((((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
              (_istackbase->tag->id == TidyTag_FRAME)) ||
             (((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
              (_istackbase->tag->id == TidyTag_FRAMESET)))) ||
            ((((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
              (_istackbase->tag->id == TidyTag_OPTGROUP)) ||
             (((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
              (_istackbase->tag->id == TidyTag_OPTION)))))))) {
          prvTidyReport(doc,pNStack_20,_istackbase,0x235);
          prvTidyFreeNode(doc,_istackbase);
          goto LAB_0013e25b;
        }
        if ((((pNStack_20 == (Node *)0x0) || (pNStack_20->tag == (Dict *)0x0)) ||
            (pNStack_20->tag->id != TidyTag_TD)) &&
           (((pNStack_20 == (Node *)0x0 || (pNStack_20->tag == (Dict *)0x0)) ||
            (pNStack_20->tag->id != TidyTag_TH)))) {
          BVar3 = prvTidynodeHasCM(_istackbase,8);
          if (BVar3 == no) {
            if (((pNStack_20 == (Node *)0x0) || (pNStack_20->tag == (Dict *)0x0)) ||
               (pNStack_20->tag->id != TidyTag_TEMPLATE)) {
              if ((_istackbase->tag->model & 4) != 0) {
                MoveToHead(doc,pNStack_20,_istackbase);
                goto LAB_0013e25b;
              }
              if (((pNStack_20 != (Node *)0x0) && (pNStack_20->tag != (Dict *)0x0)) &&
                 ((pNStack_20->tag->id == TidyTag_FORM &&
                  ((((pNStack_20->parent != (Node *)0x0 && (pNStack_20->parent->tag != (Dict *)0x0))
                    && (pNStack_20->parent->tag->id == TidyTag_TD)) &&
                   (pNStack_20->parent->implicit != no)))))) {
                if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
                   (_istackbase->tag->id == TidyTag_TD)) {
                  prvTidyReport(doc,pNStack_20,_istackbase,0x235);
                  prvTidyFreeNode(doc,_istackbase);
                  goto LAB_0013e25b;
                }
                if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
                   (_istackbase->tag->id == TidyTag_TH)) {
                  prvTidyReport(doc,pNStack_20,_istackbase,0x235);
                  prvTidyFreeNode(doc,_istackbase);
                  pNVar5 = pNStack_20->parent;
                  (*doc->allocator->vtbl->free)(doc->allocator,pNVar5->element);
                  ptVar6 = prvTidytmbstrdup(doc->allocator,"th");
                  pNVar5->element = ptVar6;
                  pDVar7 = prvTidyLookupTagDef(TidyTag_TH);
                  pNVar5->tag = pDVar7;
                  goto LAB_0013e25b;
                }
              }
              BVar3 = prvTidynodeHasCM(pNStack_20,0x8000);
              if ((BVar3 == no) && (pNStack_20->implicit == no)) {
                prvTidyReport(doc,pNStack_20,_istackbase,0x259);
              }
              if (((int)(doc->config).value[0x3b].v == 0) &&
                 (BVar3 = prvTidynodeHasCM(pNStack_20,0x8000), BVar3 != no)) {
                prvTidyReport(doc,pNStack_20,_istackbase,0x25b);
              }
              prvTidyUngetToken(doc);
              BVar3 = prvTidynodeHasCM(_istackbase,0x20);
              if (BVar3 == no) {
                BVar3 = prvTidynodeHasCM(_istackbase,0x40);
                if (BVar3 == no) {
                  BVar3 = prvTidynodeHasCM(_istackbase,0x80);
                  if ((BVar3 == no) && (BVar3 = prvTidynodeHasCM(_istackbase,0x200), BVar3 == no)) {
                    BVar3 = prvTidynodeHasCM(pNStack_20,0x800);
                    if (BVar3 != no) {
                      while (pLVar1->istackbase < pLVar1->istacksize) {
                        prvTidyPopInline(doc,(Node *)0x0);
                      }
                      pLVar1->istackbase = memory.register_2;
                      TrimSpaces(doc,pNStack_20);
                      return (Node *)0x0;
                    }
                    TrimSpaces(doc,pNStack_20);
                    return (Node *)0x0;
                  }
                  if (pLVar1->exiled != no) {
                    return (Node *)0x0;
                  }
                  _istackbase = prvTidyInferredTag(doc,TidyTag_TABLE);
                }
                else {
                  if (((pNStack_20->parent != (Node *)0x0) &&
                      (pNStack_20->parent->tag != (Dict *)0x0)) &&
                     (pNStack_20->parent->tag->id == TidyTag_DL)) {
                    TrimSpaces(doc,pNStack_20);
                    return (Node *)0x0;
                  }
                  _istackbase = prvTidyInferredTag(doc,TidyTag_DL);
                }
              }
              else {
                if (((pNStack_20->parent != (Node *)0x0) && (pNStack_20->parent->tag != (Dict *)0x0)
                    ) && (pNStack_20->parent->tag->parser == prvTidyParseList)) {
                  TrimSpaces(doc,pNStack_20);
                  return (Node *)0x0;
                }
                _istackbase = prvTidyInferredTag(doc,TidyTag_UL);
                AddClassNoIndent(doc,_istackbase);
              }
            }
          }
          else if (pLVar1->excludeBlocks != no) {
            BVar3 = prvTidynodeHasCM(pNStack_20,0x8000);
            if (BVar3 == no) {
              prvTidyReport(doc,pNStack_20,_istackbase,0x259);
            }
            prvTidyUngetToken(doc);
            BVar3 = prvTidynodeHasCM(pNStack_20,0x800);
            if (BVar3 != no) {
              pLVar1->istackbase = memory.register_2;
            }
            TrimSpaces(doc,pNStack_20);
            return (Node *)0x0;
          }
        }
        else {
          BVar3 = prvTidynodeHasCM(_istackbase,4);
          if (BVar3 != no) {
            MoveToHead(doc,pNStack_20,_istackbase);
            goto LAB_0013e25b;
          }
          BVar3 = prvTidynodeHasCM(_istackbase,0x20);
          if (BVar3 == no) {
            BVar3 = prvTidynodeHasCM(_istackbase,0x40);
            if (BVar3 != no) {
              prvTidyUngetToken(doc);
              _istackbase = prvTidyInferredTag(doc,TidyTag_DL);
              pLVar1->excludeBlocks = yes;
            }
          }
          else {
            prvTidyUngetToken(doc);
            _istackbase = prvTidyInferredTag(doc,TidyTag_UL);
            AddClassNoIndent(doc,_istackbase);
            pLVar1->excludeBlocks = yes;
          }
          BVar3 = prvTidynodeHasCM(_istackbase,8);
          if (BVar3 == no) {
            prvTidyUngetToken(doc);
            TrimSpaces(doc,pNStack_20);
            return (Node *)0x0;
          }
        }
      }
      if (((_istackbase == (Node *)0x0) || (_istackbase->tag == (Dict *)0x0)) ||
         (((_istackbase->tag->id != TidyTag_A || (_istackbase->implicit != no)) ||
          ((((pNStack_20 == (Node *)0x0 || (pNStack_20->tag == (Dict *)0x0)) ||
            (pNStack_20->tag->id != TidyTag_A)) &&
           (BVar3 = DescendantOf(pNStack_20,TidyTag_A), BVar3 == no)))))) {
        BVar3 = prvTidynodeIsElement(_istackbase);
        if (BVar3 == no) {
          if (_istackbase->type == EndTag) {
            prvTidyPopInline(doc,_istackbase);
          }
          prvTidyReport(doc,pNStack_20,_istackbase,0x235);
          prvTidyFreeNode(doc,_istackbase);
        }
        else {
          if ((_istackbase->tag->model & 0x10) == 0) {
            lexer._4_4_ = 0;
            goto LAB_0013f04b;
          }
          if (((!bVar2) || (_istackbase->implicit != no)) ||
             ((bVar2 = false, (pNStack_20->tag->model & 0x20000) != 0 ||
              (iVar4 = prvTidyInlineDup(doc,_istackbase), iVar4 < 1)))) {
            lexer._4_4_ = 1;
LAB_0013f04b:
            if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
               (_istackbase->tag->id == TidyTag_BR)) {
              TrimSpaces(doc,pNStack_20);
            }
            prvTidyInsertNodeAtEnd(pNStack_20,_istackbase);
            if (_istackbase->implicit != no) {
              prvTidyReport(doc,pNStack_20,_istackbase,0x247);
            }
            memset(&pcStack_a0,0,0x30);
            pcStack_a0 = prvTidyParseBlock;
            memory_1.original_node = _istackbase;
            memory_1.reentry_node._0_4_ = lexer._4_4_;
            memory_1.identity = (Parser *)pNStack_20;
            data.reentry_state = memory_1.reentry_node._4_4_;
            data.reentry_mode = lexer._4_4_;
            data.original_node = pNStack_20;
            data.identity = prvTidyParseBlock;
            data.reentry_node = _istackbase;
            data.mode = memory_1.reentry_mode;
            data.register_1 = memory_1.reentry_state;
            data.register_2 = memory_1.mode;
            data._44_4_ = memory_1.register_1;
            prvTidypushMemory(doc,data);
            return _istackbase;
          }
        }
      }
      else {
        if (((_istackbase->type == EndTag) || (_istackbase->attributes != (AttVal *)0x0)) ||
           ((int)(doc->config).value[9].v == 0)) {
          if (((pNStack_20 == (Node *)0x0) || (pNStack_20->tag == (Dict *)0x0)) ||
             (pNStack_20->tag->id != TidyTag_A)) {
            prvTidyReport(doc,pNStack_20,_istackbase,0x235);
            prvTidyFreeNode(doc,_istackbase);
          }
          else {
            prvTidyReport(doc,pNStack_20,_istackbase,0x259);
            prvTidyUngetToken(doc);
          }
          if ((lexer._4_4_ & Preformatted) == IgnoreWhitespace) {
            TrimSpaces(doc,pNStack_20);
          }
          return (Node *)0x0;
        }
        _istackbase->type = EndTag;
        prvTidyReport(doc,pNStack_20,_istackbase,0x232);
        prvTidyUngetToken(doc);
      }
    }
  }
  else if (((!bVar2) || (bVar2 = false, (pNStack_20->tag->model & 0x20000) != 0)) ||
          (iVar4 = prvTidyInlineDup(doc,_istackbase), iVar4 < 1)) {
    prvTidyInsertNodeAtEnd(pNStack_20,_istackbase);
    lexer._4_4_ = MixedContent;
    if (((((((pNStack_20 != (Node *)0x0) && (pNStack_20->tag != (Dict *)0x0)) &&
           (pNStack_20->tag->id == TidyTag_BODY)) ||
          (((pNStack_20 != (Node *)0x0 && (pNStack_20->tag != (Dict *)0x0)) &&
           (pNStack_20->tag->id == TidyTag_MAP)))) ||
         (((pNStack_20 != (Node *)0x0 && (pNStack_20->tag != (Dict *)0x0)) &&
          (pNStack_20->tag->id == TidyTag_BLOCKQUOTE)))) ||
        (((pNStack_20 != (Node *)0x0 && (pNStack_20->tag != (Dict *)0x0)) &&
         (pNStack_20->tag->id == TidyTag_FORM)))) ||
       (((pNStack_20 != (Node *)0x0 && (pNStack_20->tag != (Dict *)0x0)) &&
        (pNStack_20->tag->id == TidyTag_NOSCRIPT)))) {
      prvTidyConstrainVersion(doc,0xfffffedb);
    }
  }
  goto LAB_0013e25b;
}

Assistant:

Node* TY_(ParseBlock)( TidyDocImpl* doc, Node *element, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool checkstack = yes;
    uint istackbase = 0;
    DEBUG_LOG_COUNTERS;
    
    if ( element == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, because the loop overwrites this immediately. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        element = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.reentry_mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(element);

        if ( element->tag->model & CM_EMPTY )
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }

        if ( nodeIsDIV(element) && nodeIsDL(element->parent) && TY_(IsHTML5Mode)(doc) )
        {
            DEBUG_LOG_EXIT;
            return TY_(ParseDefList)(doc, element, mode); /* @warning: possible recursion! */
        }
        
        if ( nodeIsFORM(element) && DescendantOf(element, TidyTag_FORM) )
        {
            TY_(Report)(doc, element, NULL, ILLEGAL_NESTING );
        }

        /*
         InlineDup() asks the lexer to insert inline emphasis tags
         currently pushed on the istack, but take care to avoid
         propagating inline emphasis inside OBJECT or APPLET.
         For these elements a fresh inline stack context is created
         and disposed of upon reaching the end of the element.
         They thus behave like table cells in this respect.
        */
        if (element->tag->model & CM_OBJECT)
        {
            istackbase = lexer->istackbase;
            lexer->istackbase = lexer->istacksize;
        }

        if (!(element->tag->model & CM_MIXED))
        {
            TY_(InlineDup)( doc, NULL );
        }

        /*\
         *  Issue #212 - If it is likely that it may be necessary
         *  to move a leading space into a text node before this
         *  element, then keep the mode MixedContent to keep any
         *  leading space
        \*/
        if ( !(element->tag->model & CM_INLINE) ||
              (element->tag->model & CM_FIELD ) )
        {
            DEBUG_LOG_GET_OLD_MODE;
            mode = IgnoreWhitespace;
            DEBUG_LOG_CHANGE_MODE;
        }
        else if (mode == IgnoreWhitespace)
        {
            /* Issue #212 - Further fix in case ParseBlock() is called with 'IgnoreWhitespace'
               when such a leading space may need to be inserted before this element to
               preserve the browser view */
            DEBUG_LOG_GET_OLD_MODE;
            mode = MixedContent;
            DEBUG_LOG_CHANGE_MODE;
        }
    } /* Re-Entering */
    
    /*
     Main Loop
     */
    
    while ((node = TY_(GetToken)(doc, mode /*MixedContent*/)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);
        /* end tag for this element */
        if (node->type == EndTag && node->tag &&
            (node->tag == element->tag || element->was == node->tag))
        {
            TY_(FreeNode)( doc, node );

            if (element->tag->model & CM_OBJECT)
            {
                /* pop inline stack */
                while (lexer->istacksize > lexer->istackbase)
                    TY_(PopInline)( doc, NULL );
                lexer->istackbase = istackbase;
            }

            element->closed = yes;
            TrimSpaces( doc, element );
            DEBUG_LOG_EXIT;
            return NULL;
        }

        if ( nodeIsHTML(node) || nodeIsHEAD(node) || nodeIsBODY(node) )
        {
            if ( TY_(nodeIsElement)(node) )
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }


        if (node->type == EndTag)
        {
            if (node->tag == NULL)
            {
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }
            else if ( nodeIsBR(node) )
            {
                node->type = StartTag;
            }
            else if ( nodeIsP(node) )
            {
                /* Cannot have a block inside a paragraph, so no checking
                   for an ancestor is necessary -- but we _can_ have
                   paragraphs inside a block, so change it to an implicit
                   empty paragraph, to be dealt with according to the user's
                   options
                */
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if (DescendantOf( element, node->tag->id ))
            {
                /*
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                TY_(UngetToken)( doc );
                break;
            }
            else
            {
                /* special case </tr> etc. for stuff moved in front of table */
                if ( lexer->exiled
                     && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
        }

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if ( checkstack )
            {
                checkstack = no;
                if (!(element->tag->model & CM_MIXED))
                {
                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }
            }

            TY_(InsertNodeAtEnd)(element, node);
            DEBUG_LOG_GET_OLD_MODE
            mode = MixedContent;
            DEBUG_LOG_CHANGE_MODE;
            /*
              HTML4 strict doesn't allow mixed content for
              elements with %block; as their content model
            */
            /*
              But only body, map, blockquote, form and
              noscript have content model %block;
            */
            if ( nodeIsBODY(element)       ||
                 nodeIsMAP(element)        ||
                 nodeIsBLOCKQUOTE(element) ||
                 nodeIsFORM(element)       ||
                 nodeIsNOSCRIPT(element) )
                TY_(ConstrainVersion)( doc, ~VERS_HTML40_STRICT );
            continue;
        }

        if ( InsertMisc(element, node) )
            continue;

        /* allow PARAM elements? */
        if ( nodeIsPARAM(node) )
        {
            if ( TY_(nodeHasCM)(element, CM_PARAM) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* allow AREA elements? */
        if ( nodeIsAREA(node) )
        {
            if ( nodeIsMAP(element) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* ignore unknown start/end tags */
        if ( node->tag == NULL )
        {
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /*
          Allow CM_INLINE elements here.

          Allow CM_BLOCK elements here unless
          lexer->excludeBlocks is yes.

          LI and DD are special cased.

          Otherwise infer end tag for this element.
        */

        if ( !TY_(nodeHasCM)(node, CM_INLINE) )
        {
            if ( !TY_(nodeIsElement)(node) )
            {
                if ( nodeIsFORM(node) )
                    BadForm( doc );

                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }
            
            /* #427671 - Fix by Randy Waki - 10 Aug 00 */
            /*
             If an LI contains an illegal FRAME, FRAMESET, OPTGROUP, or OPTION
             start tag, discard the start tag and let the subsequent content get
             parsed as content of the enclosing LI.  This seems to mimic IE and
             Netscape, and avoids an infinite loop: without this check,
             ParseBlock (which is parsing the LI's content) and ParseList (which
             is parsing the LI's parent's content) repeatedly defer to each
             other to parse the illegal start tag, each time inferring a missing
             </li> or <li> respectively.

             NOTE: This check is a bit fragile.  It specifically checks for the
             four tags that happen to weave their way through the current series
             of tests performed by ParseBlock and ParseList to trigger the
             infinite loop.
            */
            if ( nodeIsLI(element) )
            {
                if ( nodeIsFRAME(node)    ||
                     nodeIsFRAMESET(node) ||
                     nodeIsOPTGROUP(node) ||
                     nodeIsOPTION(node) )
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                    TY_(FreeNode)( doc, node );  /* DSR - 27Apr02 avoid memory leak */
                    continue;
                }
            }

            if ( nodeIsTD(element) || nodeIsTH(element) )
            {
                /* if parent is a table cell, avoid inferring the end of the cell */

                if ( TY_(nodeHasCM)(node, CM_HEAD) )
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                    lexer->excludeBlocks = yes;
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_DL);
                    lexer->excludeBlocks = yes;
                }

                /* infer end of current table cell */
                if ( !TY_(nodeHasCM)(node, CM_BLOCK) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
            else if ( TY_(nodeHasCM)(node, CM_BLOCK) )
            {
                if ( lexer->excludeBlocks )
                {
                    if ( !TY_(nodeHasCM)(element, CM_OPT) )
                        TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );

                    TY_(UngetToken)( doc );

                    if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                        lexer->istackbase = istackbase;

                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
            else if ( ! nodeIsTEMPLATE( element ) )/* things like list items */
            {
                if (node->tag->model & CM_HEAD)
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                /*
                 special case where a form start tag
                 occurs in a tr and is followed by td or th
                */

                if ( nodeIsFORM(element) &&
                     nodeIsTD(element->parent) &&
                     element->parent->implicit )
                {
                    if ( nodeIsTD(node) )
                    {
                        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        continue;
                    }

                    if ( nodeIsTH(node) )
                    {
                        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        node = element->parent;
                        TidyDocFree(doc, node->element);
                        node->element = TY_(tmbstrdup)(doc->allocator, "th");
                        node->tag = TY_(LookupTagDef)( TidyTag_TH );
                        continue;
                    }
                }

                if ( !TY_(nodeHasCM)(element, CM_OPT) && !element->implicit )
                    TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );

                /* #521, warn on missing optional end-tags if not omitting them. */
                if ( cfgBool( doc, TidyOmitOptionalTags ) == no && TY_(nodeHasCM)(element, CM_OPT) )
                    TY_(Report)(doc, element, node, MISSING_ENDTAG_OPTIONAL );


                TY_(UngetToken)( doc );

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    if ( element->parent && element->parent->tag &&
                         element->parent->tag->parser == TY_(ParseList) )
                    {
                        TrimSpaces( doc, element );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    if ( nodeIsDL(element->parent) )
                    {
                        TrimSpaces( doc, element );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_DL);
                }
                else if ( TY_(nodeHasCM)(node, CM_TABLE) || TY_(nodeHasCM)(node, CM_ROW) )
                {
                    /* http://tidy.sf.net/issue/1316307 */
                    /* In exiled mode, return so table processing can
                       continue. */
                    if (lexer->exiled)
                    {
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                else if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                {
                    /* pop inline stack */
                    while ( lexer->istacksize > lexer->istackbase )
                        TY_(PopInline)( doc, NULL );
                    lexer->istackbase = istackbase;
                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;

                }
                else
                {
                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
        }

        /*\
         *  Issue #307 - an <A> tag to ends any open <A> element
         *  Like #427827 - fixed by Randy Waki and Bjoern Hoehrmann 23 Aug 00
         *  in ParseInline(), fix copied HERE to ParseBlock()
         *  href: http://www.w3.org/TR/html-markup/a.html
         *  The interactive element a must not appear as a descendant of the a element.
        \*/
        if ( nodeIsA(node) && !node->implicit &&
             (nodeIsA(element) || DescendantOf(element, TidyTag_A)) )
        {
            if (node->type != EndTag && node->attributes == NULL
                && cfgBool(doc, TidyCoerceEndTags) )
            {
                node->type = EndTag;
                TY_(Report)(doc, element, node, COERCE_TO_ENDTAG);
                TY_(UngetToken)( doc );
                continue;
            }

            if (nodeIsA(element))
            {
                TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);
                TY_(UngetToken)( doc );
            }
            else
            {
                /* Issue #597 - if we not 'UngetToken' then it is being discarded.
                   Add message, and 'FreeNode' - thanks @ralfjunker */
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
            }

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* parse known element */
        if (TY_(nodeIsElement)(node))
        {
            if (node->tag->model & CM_INLINE)
            {
                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if (!(element->tag->model & CM_MIXED)) /* #431731 - fix by Randy Waki 25 Dec 00 */
                    {
                        if ( TY_(InlineDup)(doc, node) > 0 )
                            continue;
                    }
                }

                DEBUG_LOG_GET_OLD_MODE;
                mode = MixedContent;
                DEBUG_LOG_CHANGE_MODE;
            }
            else
            {
                checkstack = yes;
                DEBUG_LOG_GET_OLD_MODE;
                mode = IgnoreWhitespace;
                DEBUG_LOG_CHANGE_MODE;
            }

            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces( doc, element );

            TY_(InsertNodeAtEnd)(element, node);

            if (node->implicit)
                TY_(Report)(doc, element, node, INSERTING_TAG );

            /* Issue #212 - WHY is this hard coded to 'IgnoreWhitespace' while an
               effort has been made above to set a 'MixedContent' mode in some cases?
               WHY IS THE 'mode' VARIABLE NOT USED HERE???? */

            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseBlock);
                memory.reentry_node = node;
                memory.reentry_mode = mode;
                memory.original_node = element;
                TY_(pushMemory)(doc, memory);
                DEBUG_LOG_EXIT_WITH_NODE(node);
            }
            return node;
        }

        /* discard unexpected tags */
        if (node->type == EndTag)
            TY_(PopInline)( doc, node );  /* if inline end tag */

        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, node );
        continue;
    }

    if (!(element->tag->model & CM_OPT))
        TY_(Report)(doc, element, node, MISSING_ENDTAG_FOR);

    if (element->tag->model & CM_OBJECT)
    {
        /* pop inline stack */
        while ( lexer->istacksize > lexer->istackbase )
            TY_(PopInline)( doc, NULL );
        lexer->istackbase = istackbase;
    }

    TrimSpaces( doc, element );

    DEBUG_LOG_EXIT;
    return NULL;
}